

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error storeEntityValue(XML_Parser parser,ENCODING *enc,char *entityTextPtr,char *entityTextEnd)

{
  STRING_POOL *pool;
  char cVar1;
  int iVar2;
  XML_Error XVar3;
  uint uVar4;
  XML_Char *pXVar5;
  NAMED *pNVar6;
  undefined1 *puVar7;
  char *pcVar8;
  ulong uVar9;
  char *next;
  XML_Char buf [4];
  char *local_50;
  char local_44 [4];
  HASH_TABLE *local_40;
  STRING_POOL *local_38;
  
  pool = (STRING_POOL *)((long)parser + 0x330);
  local_38 = (STRING_POOL *)((long)parser + 0x418);
  local_40 = (HASH_TABLE *)((long)parser + 0x368);
  do {
    iVar2 = (*enc->literalScanners[1])(enc,entityTextPtr,entityTextEnd,&local_50);
    switch(iVar2) {
    case 0:
      if (*(ENCODING **)((long)parser + 0x118) == enc) {
        *(char **)((long)parser + 0x218) = local_50;
        return XML_ERROR_INVALID_TOKEN;
      }
      return XML_ERROR_INVALID_TOKEN;
    case 6:
    case 9:
      pXVar5 = poolAppend(pool,enc,entityTextPtr,local_50);
      entityTextPtr = local_50;
      if (pXVar5 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 10:
      iVar2 = (*enc->charRefNumber)(enc,entityTextPtr);
      if ((iVar2 < 0) || (uVar4 = cm_expat_XmlUtf8Encode(iVar2,local_44), uVar4 == 0)) {
        if (*(ENCODING **)((long)parser + 0x118) == enc) {
          *(char **)((long)parser + 0x218) = entityTextPtr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        return XML_ERROR_BAD_CHAR_REF;
      }
      entityTextPtr = local_50;
      if (0 < (int)uVar4) {
        uVar9 = 0;
        do {
          pcVar8 = *(char **)((long)parser + 0x348);
          if (*(char **)((long)parser + 0x340) == pcVar8) {
            iVar2 = poolGrow(pool);
            if (iVar2 == 0) {
              return XML_ERROR_NO_MEMORY;
            }
            pcVar8 = *(char **)((long)parser + 0x348);
          }
          cVar1 = local_44[uVar9];
          *(char **)((long)parser + 0x348) = pcVar8 + 1;
          *pcVar8 = cVar1;
          uVar9 = uVar9 + 1;
          entityTextPtr = local_50;
        } while (uVar4 != uVar9);
      }
      break;
    case -4:
      return XML_ERROR_NONE;
    case -3:
      local_50 = entityTextPtr + enc->minBytesPerChar;
    case 7:
      puVar7 = *(undefined1 **)((long)parser + 0x348);
      if (*(undefined1 **)((long)parser + 0x340) == puVar7) {
        iVar2 = poolGrow(pool);
        if (iVar2 == 0) {
          return XML_ERROR_NO_MEMORY;
        }
        puVar7 = *(undefined1 **)((long)parser + 0x348);
      }
      *(undefined1 **)((long)parser + 0x348) = puVar7 + 1;
      *puVar7 = 10;
      entityTextPtr = local_50;
      break;
    case -2:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 8:
switchD_004c8708_caseD_fffffffe:
      XVar3 = XML_ERROR_UNEXPECTED_STATE;
LAB_004c88ff:
      if (*(ENCODING **)((long)parser + 0x118) == enc) {
        *(char **)((long)parser + 0x218) = entityTextPtr;
        return XVar3;
      }
      return XVar3;
    case -1:
      XVar3 = XML_ERROR_INVALID_TOKEN;
      goto LAB_004c88ff;
    default:
      if (iVar2 != 0x1c) goto switchD_004c8708_caseD_fffffffe;
      if ((*(long *)((long)parser + 0x490) == 0) && (*(ENCODING **)((long)parser + 0x118) == enc)) {
        *(char **)((long)parser + 0x218) = entityTextPtr;
        return XML_ERROR_SYNTAX;
      }
      pXVar5 = poolStoreString(local_38,enc,entityTextPtr + enc->minBytesPerChar,
                               local_50 + -(long)enc->minBytesPerChar);
      if (pXVar5 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      pNVar6 = lookup(local_40,pXVar5,0);
      *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
      if (pNVar6 == (NAMED *)0x0) {
        XVar3 = XML_ERROR_UNDEFINED_ENTITY;
        goto LAB_004c88ff;
      }
      if (*(char *)&pNVar6[7].name != '\0') {
        XVar3 = XML_ERROR_RECURSIVE_ENTITY_REF;
        goto LAB_004c88ff;
      }
      if (pNVar6[3].name != (KEY)0x0) {
        XVar3 = XML_ERROR_PARAM_ENTITY_REF;
        goto LAB_004c88ff;
      }
      *(undefined1 *)&pNVar6[7].name = 1;
      XVar3 = storeEntityValue(parser,*(ENCODING **)((long)parser + 0x1b8),pNVar6[1].name,
                               pNVar6[1].name + *(int *)&pNVar6[2].name);
      *(undefined1 *)&pNVar6[7].name = 0;
      entityTextPtr = local_50;
      if (XVar3 != XML_ERROR_NONE) {
        return XVar3;
      }
    }
  } while( true );
}

Assistant:

static
enum XML_Error storeEntityValue(XML_Parser parser,
                                const ENCODING *enc,
                                const char *entityTextPtr,
                                const char *entityTextEnd)
{
  STRING_POOL *pool = &(dtd.pool);
  for (;;) {
    const char *next;
    int tok = XmlEntityValueTok(enc, entityTextPtr, entityTextEnd, &next);
    switch (tok) {
    case XML_TOK_PARAM_ENTITY_REF:
#ifdef XML_DTD
      if (parentParser || enc != encoding) {
        enum XML_Error result;
        const XML_Char *name;
        ENTITY *entity;
        name = poolStoreString(&tempPool, enc,
                               entityTextPtr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(&dtd.paramEntities, name, 0);
        poolDiscard(&tempPool);
        if (!entity) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_UNDEFINED_ENTITY;
        }
        if (entity->open) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (entity->systemId) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_PARAM_ENTITY_REF;
        }
        entity->open = 1;
        result = storeEntityValue(parser,
                                  internalEncoding,
                                  (char *)entity->textPtr,
                                  (char *)(entity->textPtr + entity->textLen));
        entity->open = 0;
        if (result)
          return result;
        break;
      }
#endif /* XML_DTD */
      eventPtr = entityTextPtr;
      return XML_ERROR_SYNTAX;
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_ENTITY_REF:
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, entityTextPtr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = entityTextPtr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_DATA_NEWLINE:
      if (pool->end == pool->ptr && !poolGrow(pool))
        return XML_ERROR_NO_MEMORY;
      *(pool->ptr)++ = 0xA;
      break;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, entityTextPtr);
        if (n < 0) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        n = XmlEncode(n, (ICHAR *)buf);
        if (!n) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        for (i = 0; i < n; i++) {
          if (pool->end == pool->ptr && !poolGrow(pool))
            return XML_ERROR_NO_MEMORY;
          *(pool->ptr)++ = buf[i];
        }
      }
      break;
    case XML_TOK_PARTIAL:
      if (enc == encoding)
        eventPtr = entityTextPtr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_INVALID:
      if (enc == encoding)
        eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    default:
      if (enc == encoding)
        eventPtr = entityTextPtr;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    entityTextPtr = next;
  }
  /* not reached */
}